

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O2

void wasm::OptUtils::optimizeAfterInlining
               (unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                *funcs,Module *module,PassRunner *parentRunner)

{
  pointer puVar1;
  pointer puVar2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar3;
  __node_base *p_Var4;
  PassOptions local_228;
  undefined1 local_180 [8];
  PassRunner runner;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  local_48;
  allocator<char> local_21;
  
  local_48.
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (module->functions).
       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (module->functions).
       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (module->functions).
       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (module->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (module->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (module->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Module::updateFunctionsMap(module);
  p_Var4 = &(funcs->_M_h)._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    Module::addFunction(module,(Function *)p_Var4[1]._M_nxt);
  }
  PassOptions::PassOptions(&local_228,&parentRunner->options);
  PassRunner::PassRunner((PassRunner *)local_180,module,&local_228);
  PassOptions::~PassOptions(&local_228);
  runner.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_1_ = 1;
  runner.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&runner.skippedPasses._M_h._M_single_bucket,"precompute-propagate",&local_21)
  ;
  PassRunner::add((PassRunner *)local_180,(string *)&runner.skippedPasses._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&runner.skippedPasses._M_h._M_single_bucket);
  PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)local_180);
  PassRunner::run((PassRunner *)local_180);
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    (puVar3->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = (Function *)0x0;
  }
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (module->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (module->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (module->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar1;
  local_48.
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  local_48.
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
  Module::updateFunctionsMap(module);
  PassRunner::~PassRunner((PassRunner *)local_180);
  std::
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

inline void optimizeAfterInlining(const std::unordered_set<Function*>& funcs,
                                  Module* module,
                                  PassRunner* parentRunner) {
  // save the full list of functions on the side
  std::vector<std::unique_ptr<Function>> all;
  all.swap(module->functions);
  module->updateFunctionsMap();
  for (auto& func : funcs) {
    module->addFunction(func);
  }
  PassRunner runner(module, parentRunner->options);
  runner.setIsNested(true);
  runner.setValidateGlobally(false); // not a full valid module
  // this is especially useful after inlining
  runner.add("precompute-propagate");
  runner.addDefaultFunctionOptimizationPasses(); // do all the usual stuff
  runner.run();
  // restore all the funcs
  for (auto& func : module->functions) {
    func.release();
  }
  all.swap(module->functions);
  module->updateFunctionsMap();
}